

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::bump_variables(Internal *this)

{
  Internal *pIVar1;
  int *piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  Profile *in_RSI;
  Profile *profile;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int *lit;
  int *piVar6;
  uint *puVar7;
  double s;
  double s_00;
  
  pIVar1 = this->internal;
  profile = in_RSI;
  if ((pIVar1->profiles).bump.level <= (pIVar1->opts).profile) {
    profile = &(pIVar1->profiles).bump;
    time(pIVar1,(time_t *)in_RSI);
    start_profiling(pIVar1,profile,s);
  }
  if ((this->opts).bumpreason != 0) {
    piVar2 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
      profile = (Profile *)(ulong)(uint)-*piVar6;
      bump_also_reason_literals(this,-*piVar6,(uint)this->stable + (this->opts).bumpreasondepth);
    }
  }
  if (((this->opts).score == 0) || ((this->stable & 1U) == 0)) {
    __first._M_current =
         (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 2;
    if ((ulong)(long)(this->opts).radixsortlim < uVar5) {
      rsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_bumped_rank>
                (__first,__last,(analyze_bumped_rank)this);
      profile = (Profile *)__last._M_current;
    }
    else if (__first._M_current != __last._M_current) {
      lVar4 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>>
                (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>)this);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>>
                (__first,__last,(_Iter_comp_iter<CaDiCaL::analyze_bumped_smaller>)this);
      profile = (Profile *)__last._M_current;
    }
  }
  puVar3 = (uint *)(this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar7 = (uint *)(this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    profile = (Profile *)(ulong)*puVar7;
    bump_variable(this,*puVar7);
  }
  if (((this->opts).score != 0) && ((this->stable & 1U) != 0)) {
    bump_variable_score_inc(this);
  }
  pIVar1 = this->internal;
  if ((pIVar1->opts).profile < (pIVar1->profiles).bump.level) {
    return;
  }
  time(pIVar1,(time_t *)profile);
  stop_profiling(pIVar1,&(pIVar1->profiles).bump,s_00);
  return;
}

Assistant:

void Internal::bump_variables () {

  assert (opts.bump);

  START (bump);

  if (opts.bumpreason)
    bump_also_all_reason_literals ();

  if (!use_scores ()) {

    // Variables are bumped in the order they are in the current decision
    // queue.  This maintains relative order between bumped variables in
    // the queue and seems to work best.  We also experimented with
    // focusing on variables of the last decision level, but results were
    // mixed.

    MSORT (opts.radixsortlim, analyzed.begin (), analyzed.end (),
           analyze_bumped_rank (this), analyze_bumped_smaller (this));
  }

  for (const auto &lit : analyzed)
    bump_variable (lit);

  if (use_scores ())
    bump_variable_score_inc ();

  STOP (bump);
}